

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.cpp
# Opt level: O0

void linenoiseEditStop(linenoiseState *l)

{
  int iVar1;
  long in_RDI;
  
  iVar1 = isatty(*(int *)(in_RDI + 0x10));
  if (iVar1 != 0) {
    disableRawMode(0);
    printf("\n");
  }
  return;
}

Assistant:

void linenoiseEditStop(struct linenoiseState *l) {
    if (!isatty(l->ifd)) return;
    disableRawMode(l->ifd);
    printf("\n");
}